

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_block_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LocalSingleBlockLoadStoreElimPass::LocalSingleBlockLoadStoreElim
          (LocalSingleBlockLoadStoreElimPass *this,Function *func)

{
  Op OVar1;
  Instruction *pIVar2;
  __node_base_ptr p_Var3;
  IRContext *pIVar4;
  iterator iVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  BasicBlock *pBVar9;
  Instruction *pIVar10;
  _Hash_node_base *p_Var11;
  size_type sVar12;
  Instruction *extraout_RAX;
  __node_base_ptr p_Var13;
  reference ppIVar14;
  mapped_type *ppIVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  Instruction *this_00;
  __node_base_ptr p_Var20;
  byte bVar21;
  pointer puVar22;
  Instruction **ppIVar23;
  Instruction *ip;
  uint32_t varId;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  instructions_to_kill;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  instructions_to_save;
  uint32_t local_ac;
  undefined8 local_a8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_a0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_98;
  Instruction *local_90;
  Instruction **local_88;
  iterator iStack_80;
  Instruction **local_78;
  Function *local_70;
  undefined1 local_68 [40];
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  local_88 = (Instruction **)0x0;
  iStack_80._M_current = (Instruction **)0x0;
  local_78 = (Instruction **)0x0;
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = (Instruction *)0x1;
  local_68._16_8_ = (Instruction *)0x0;
  local_68._24_8_ = 0;
  local_68._32_4_ = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  puVar22 = (func->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_70 = func;
  if (puVar22 ==
      (func->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar21 = 0;
    ppIVar23 = local_88;
    iVar5._M_current = iStack_80._M_current;
  }
  else {
    local_98 = &(this->var2store_)._M_h;
    local_a0 = &(this->var2load_)._M_h;
    local_a8 = 0;
    do {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_98);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_a0);
      pBVar9 = (puVar22->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      ip = *(Instruction **)
            ((long)&(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      while (ip != &(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
        pIVar2 = (ip->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        OVar1 = ip->opcode_;
        if (OVar1 == OpFunctionCall) {
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::clear(local_98);
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::clear(local_a0);
        }
        else if (OVar1 == OpLoad) {
          pIVar10 = MemPass::GetPtr(&this->super_MemPass,ip,&local_ac);
          bVar6 = MemPass::IsTargetVar(&this->super_MemPass,local_ac);
          if ((bVar6) && (bVar6 = HasOnlySupportedRefs(this,local_ac), bVar6)) {
            uVar18 = (ulong)local_ac;
            if (pIVar10->opcode_ == OpVariable) {
              uVar16 = (this->var2store_)._M_h._M_bucket_count;
              uVar17 = uVar18 % uVar16;
              p_Var3 = local_98->_M_buckets[uVar17];
              p_Var13 = (__node_base_ptr)0x0;
              if ((p_Var3 != (__node_base_ptr)0x0) &&
                 (p_Var13 = p_Var3, p_Var20 = p_Var3->_M_nxt,
                 local_ac != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
                while (p_Var11 = p_Var20->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
                  p_Var13 = (__node_base_ptr)0x0;
                  if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar16 != uVar17) ||
                     (p_Var13 = p_Var20, p_Var20 = p_Var11, local_ac == *(uint *)&p_Var11[1]._M_nxt)
                     ) goto LAB_00243b6a;
                }
                p_Var13 = (__node_base_ptr)0x0;
              }
LAB_00243b6a:
              if (p_Var13 == (__node_base_ptr)0x0) {
                p_Var11 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var11 = p_Var13->_M_nxt;
              }
              if (p_Var11 == (_Hash_node_base *)0x0) {
                uVar16 = (this->var2load_)._M_h._M_bucket_count;
                uVar18 = uVar18 % uVar16;
                p_Var3 = (this->var2load_)._M_h._M_buckets[uVar18];
                p_Var13 = (__node_base_ptr)0x0;
                if ((p_Var3 != (__node_base_ptr)0x0) &&
                   (p_Var13 = p_Var3, p_Var20 = p_Var3->_M_nxt,
                   local_ac != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
                  while (p_Var11 = p_Var20->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
                    p_Var13 = (__node_base_ptr)0x0;
                    if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar16 != uVar18) ||
                       (p_Var13 = p_Var20, p_Var20 = p_Var11,
                       local_ac == *(uint *)&p_Var11[1]._M_nxt)) goto LAB_00243e3c;
                  }
                  p_Var13 = (__node_base_ptr)0x0;
                }
LAB_00243e3c:
                if (p_Var13 == (__node_base_ptr)0x0) {
                  p_Var11 = (_Hash_node_base *)0x0;
                }
                else {
                  p_Var11 = p_Var13->_M_nxt;
                }
                uVar7 = 0;
                if ((p_Var11 == (_Hash_node_base *)0x0) ||
                   (this_00 = (Instruction *)p_Var11[2]._M_nxt, this_00->has_result_id_ != true))
                goto LAB_00243c3e;
                uVar7 = (uint32_t)this_00->has_type_id_;
              }
              else {
                this_00 = (Instruction *)p_Var11[2]._M_nxt;
                uVar19 = (this_00->has_result_id_ & 1) + 1;
                if (this_00->has_type_id_ == false) {
                  uVar19 = (uint)this_00->has_result_id_;
                }
                uVar7 = uVar19 + 1;
              }
              uVar7 = Instruction::GetSingleWordOperand(this_00,uVar7);
            }
            else {
              uVar16 = (this->var2store_)._M_h._M_bucket_count;
              uVar18 = uVar18 % uVar16;
              p_Var3 = local_98->_M_buckets[uVar18];
              p_Var13 = (__node_base_ptr)0x0;
              if ((p_Var3 != (__node_base_ptr)0x0) &&
                 (p_Var13 = p_Var3, p_Var20 = p_Var3->_M_nxt,
                 local_ac != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
                while (p_Var11 = p_Var20->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
                  p_Var13 = (__node_base_ptr)0x0;
                  if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar16 != uVar18) ||
                     (p_Var13 = p_Var20, p_Var20 = p_Var11, local_ac == *(uint *)&p_Var11[1]._M_nxt)
                     ) goto LAB_00243c12;
                }
                p_Var13 = (__node_base_ptr)0x0;
              }
LAB_00243c12:
              if (p_Var13 == (__node_base_ptr)0x0) {
                p_Var11 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var11 = p_Var13->_M_nxt;
              }
              uVar7 = 0;
              if (p_Var11 != (_Hash_node_base *)0x0) {
                local_90 = (Instruction *)local_68;
                std::
                _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                          ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_90,p_Var11 + 2,&local_90);
              }
            }
LAB_00243c3e:
            if (uVar7 == 0) {
              if (pIVar10->opcode_ == OpVariable) {
                ppIVar15 = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_a0,&local_ac);
                *ppIVar15 = ip;
              }
            }
            else {
              IRContext::KillNamesAndDecorates((this->super_MemPass).super_Pass.context_,ip);
              pIVar4 = (this->super_MemPass).super_Pass.context_;
              uVar8 = 0;
              if (ip->has_result_id_ == true) {
                uVar8 = Instruction::GetSingleWordOperand(ip,(uint)ip->has_type_id_);
              }
              IRContext::ReplaceAllUsesWith(pIVar4,uVar8,uVar7);
              local_90 = ip;
              ppIVar14 = std::
                         vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                         ::emplace_back<spvtools::opt::Instruction*>
                                   ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                                     *)&local_88,&local_90);
              local_a8 = CONCAT71((int7)((ulong)ppIVar14 >> 8),1);
            }
          }
        }
        else if (OVar1 == OpStore) {
          pIVar10 = MemPass::GetPtr(&this->super_MemPass,ip,&local_ac);
          bVar6 = MemPass::IsTargetVar(&this->super_MemPass,local_ac);
          if ((bVar6) && (bVar6 = HasOnlySupportedRefs(this,local_ac), bVar6)) {
            if (pIVar10->opcode_ == OpVariable) {
              uVar18 = (this->var2store_)._M_h._M_bucket_count;
              uVar16 = (ulong)local_ac % uVar18;
              p_Var3 = (this->var2store_)._M_h._M_buckets[uVar16];
              p_Var13 = (__node_base_ptr)0x0;
              if ((p_Var3 != (__node_base_ptr)0x0) &&
                 (p_Var13 = p_Var3, p_Var20 = p_Var3->_M_nxt,
                 local_ac != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
                while (p_Var11 = p_Var20->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
                  p_Var13 = (__node_base_ptr)0x0;
                  if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar18 != uVar16) ||
                     (p_Var13 = p_Var20, p_Var20 = p_Var11, local_ac == *(uint *)&p_Var11[1]._M_nxt)
                     ) goto LAB_00243cc0;
                }
                p_Var13 = (__node_base_ptr)0x0;
              }
LAB_00243cc0:
              if (p_Var13 == (__node_base_ptr)0x0) {
                p_Var11 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var11 = p_Var13->_M_nxt;
              }
              if (p_Var11 != (_Hash_node_base *)0x0) {
                p_Var11 = p_Var11 + 2;
                sVar12 = std::
                         _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)local_68,(key_type *)p_Var11);
                if (sVar12 == 0) {
                  pIVar4 = (this->super_MemPass).super_Pass.context_;
                  if ((pIVar4->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
                    IRContext::BuildDebugInfoManager(pIVar4);
                  }
                  bVar6 = analysis::DebugInfoManager::IsVariableDebugDeclared
                                    ((pIVar4->debug_info_mgr_)._M_t.
                                     super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                     .
                                     super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                                     ._M_head_impl,local_ac);
                  if (!bVar6) {
                    if (iStack_80._M_current == local_78) {
                      std::
                      vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      ::_M_realloc_insert<spvtools::opt::Instruction*const&>
                                ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                                  *)&local_88,iStack_80,(Instruction **)p_Var11);
                      pIVar10 = extraout_RAX;
                    }
                    else {
                      pIVar10 = (Instruction *)p_Var11->_M_nxt;
                      *iStack_80._M_current = pIVar10;
                      iStack_80._M_current = iStack_80._M_current + 1;
                    }
                    local_a8 = CONCAT71((int7)((ulong)pIVar10 >> 8),1);
                  }
                }
              }
              uVar18 = (this->var2load_)._M_h._M_bucket_count;
              uVar16 = (ulong)local_ac % uVar18;
              p_Var3 = (this->var2load_)._M_h._M_buckets[uVar16];
              p_Var13 = (__node_base_ptr)0x0;
              if ((p_Var3 != (__node_base_ptr)0x0) &&
                 (p_Var13 = p_Var3, p_Var20 = p_Var3->_M_nxt,
                 local_ac != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
                while (p_Var11 = p_Var20->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
                  p_Var13 = (__node_base_ptr)0x0;
                  if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar18 != uVar16) ||
                     (p_Var13 = p_Var20, p_Var20 = p_Var11, local_ac == *(uint *)&p_Var11[1]._M_nxt)
                     ) goto LAB_00243da8;
                }
                p_Var13 = (__node_base_ptr)0x0;
              }
LAB_00243da8:
              if (p_Var13 == (__node_base_ptr)0x0) {
                p_Var11 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var11 = p_Var13->_M_nxt;
              }
              if (p_Var11 != (_Hash_node_base *)0x0) {
                uVar19 = (ip->has_result_id_ & 1) + 1;
                if (ip->has_type_id_ == false) {
                  uVar19 = (uint)ip->has_result_id_;
                }
                uVar7 = Instruction::GetSingleWordOperand(ip,uVar19 + 1);
                pIVar10 = (Instruction *)p_Var11[2]._M_nxt;
                uVar8 = 0;
                if (pIVar10->has_result_id_ == true) {
                  uVar8 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
                }
                if (uVar7 == uVar8) {
                  local_90 = ip;
                  ppIVar14 = std::
                             vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                             ::emplace_back<spvtools::opt::Instruction*>
                                       ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                                         *)&local_88,&local_90);
                  local_a8 = CONCAT71((int7)((ulong)ppIVar14 >> 8),1);
                  goto LAB_00243cb5;
                }
              }
              ppIVar15 = std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)local_98,&local_ac);
              *ppIVar15 = ip;
            }
            else {
              bVar6 = MemPass::IsNonPtrAccessChain(&this->super_MemPass,pIVar10->opcode_);
              if (!bVar6) {
                __assert_fail("IsNonPtrAccessChain(ptrInst->opcode())",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_single_block_elim_pass.cpp"
                              ,0x6d,
                              "bool spvtools::opt::LocalSingleBlockLoadStoreElimPass::LocalSingleBlockLoadStoreElim(Function *)"
                             );
              }
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_erase(local_98,&local_ac);
            }
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(local_a0,&local_ac);
          }
        }
LAB_00243cb5:
        ip = pIVar2;
        pBVar9 = (puVar22->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      }
      puVar22 = puVar22 + 1;
    } while (puVar22 !=
             (local_70->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    bVar21 = (byte)local_a8;
    ppIVar23 = local_88;
    iVar5._M_current = iStack_80._M_current;
  }
  for (; ppIVar23 != iVar5._M_current; ppIVar23 = ppIVar23 + 1) {
    IRContext::KillInst((this->super_MemPass).super_Pass.context_,*ppIVar23);
  }
  std::
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  if (local_88 != (Instruction **)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return (bool)(bVar21 & 1);
}

Assistant:

bool LocalSingleBlockLoadStoreElimPass::LocalSingleBlockLoadStoreElim(
    Function* func) {
  // Perform local store/load, load/load and store/store elimination
  // on each block
  bool modified = false;
  std::vector<Instruction*> instructions_to_kill;
  std::unordered_set<Instruction*> instructions_to_save;
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    var2store_.clear();
    var2load_.clear();
    auto next = bi->begin();
    for (auto ii = next; ii != bi->end(); ii = next) {
      ++next;
      switch (ii->opcode()) {
        case spv::Op::OpStore: {
          // Verify store variable is target type
          uint32_t varId;
          Instruction* ptrInst = GetPtr(&*ii, &varId);
          if (!IsTargetVar(varId)) continue;
          if (!HasOnlySupportedRefs(varId)) continue;
          // If a store to the whole variable, remember it for succeeding
          // loads and stores. Otherwise forget any previous store to that
          // variable.
          if (ptrInst->opcode() == spv::Op::OpVariable) {
            // If a previous store to same variable, mark the store
            // for deletion if not still used. Don't delete store
            // if debugging; let ssa-rewrite and DCE handle it
            auto prev_store = var2store_.find(varId);
            if (prev_store != var2store_.end() &&
                instructions_to_save.count(prev_store->second) == 0 &&
                !context()->get_debug_info_mgr()->IsVariableDebugDeclared(
                    varId)) {
              instructions_to_kill.push_back(prev_store->second);
              modified = true;
            }

            bool kill_store = false;
            auto li = var2load_.find(varId);
            if (li != var2load_.end()) {
              if (ii->GetSingleWordInOperand(kStoreValIdInIdx) ==
                  li->second->result_id()) {
                // We are storing the same value that already exists in the
                // memory location.  The store does nothing.
                kill_store = true;
              }
            }

            if (!kill_store) {
              var2store_[varId] = &*ii;
              var2load_.erase(varId);
            } else {
              instructions_to_kill.push_back(&*ii);
              modified = true;
            }
          } else {
            assert(IsNonPtrAccessChain(ptrInst->opcode()));
            var2store_.erase(varId);
            var2load_.erase(varId);
          }
        } break;
        case spv::Op::OpLoad: {
          // Verify store variable is target type
          uint32_t varId;
          Instruction* ptrInst = GetPtr(&*ii, &varId);
          if (!IsTargetVar(varId)) continue;
          if (!HasOnlySupportedRefs(varId)) continue;
          uint32_t replId = 0;
          if (ptrInst->opcode() == spv::Op::OpVariable) {
            // If a load from a variable, look for a previous store or
            // load from that variable and use its value.
            auto si = var2store_.find(varId);
            if (si != var2store_.end()) {
              replId = si->second->GetSingleWordInOperand(kStoreValIdInIdx);
            } else {
              auto li = var2load_.find(varId);
              if (li != var2load_.end()) {
                replId = li->second->result_id();
              }
            }
          } else {
            // If a partial load of a previously seen store, remember
            // not to delete the store.
            auto si = var2store_.find(varId);
            if (si != var2store_.end()) instructions_to_save.insert(si->second);
          }
          if (replId != 0) {
            // replace load's result id and delete load
            context()->KillNamesAndDecorates(&*ii);
            context()->ReplaceAllUsesWith(ii->result_id(), replId);
            instructions_to_kill.push_back(&*ii);
            modified = true;
          } else {
            if (ptrInst->opcode() == spv::Op::OpVariable)
              var2load_[varId] = &*ii;  // register load
          }
        } break;
        case spv::Op::OpFunctionCall: {
          // Conservatively assume all locals are redefined for now.
          // TODO(): Handle more optimally
          var2store_.clear();
          var2load_.clear();
        } break;
        default:
          break;
      }
    }
  }

  for (Instruction* inst : instructions_to_kill) {
    context()->KillInst(inst);
  }

  return modified;
}